

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterio.cpp
# Opt level: O3

void anon_unknown.dwarf_b4f1::LoadParameters
               (FILE *fp,int *number_of_frames,int *fft_size,int *number_of_dimensions)

{
  int iVar1;
  char data_check [12];
  undefined1 local_34 [12];
  
  fread(local_34,1,4,(FILE *)fp);
  fread(number_of_frames,4,1,(FILE *)fp);
  fread(local_34,1,0xc,(FILE *)fp);
  fread(local_34,1,4,(FILE *)fp);
  fread(fft_size,4,1,(FILE *)fp);
  fread(local_34,1,4,(FILE *)fp);
  fread(number_of_dimensions,4,1,(FILE *)fp);
  iVar1 = *number_of_dimensions;
  if (iVar1 == 0) {
    iVar1 = *fft_size / 2 + 1;
  }
  *number_of_dimensions = iVar1;
  fread(local_34,1,8,(FILE *)fp);
  return;
}

Assistant:

static void LoadParameters(FILE *fp, int *number_of_frames, int *fft_size,
    int *number_of_dimensions) {
  char data_check[12];
  fread(&data_check, 1, 4, fp);  // NOF
  fread(number_of_frames, 4, 1, fp);

  fread(&data_check, 1, 12, fp);  // FP (skipped)

  fread(&data_check, 1, 4, fp);  // FFT
  fread(fft_size, 4, 1, fp);

  fread(&data_check, 1, 4, fp);  // NOD
  fread(number_of_dimensions, 4, 1, fp);
  *number_of_dimensions =
    *number_of_dimensions == 0 ? *fft_size / 2 + 1 : *number_of_dimensions;

  fread(&data_check, 1, 8, fp);  // FS (skipped)
}